

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z3_4x8_sse4_1
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  short sVar17;
  ushort uVar18;
  short sVar23;
  short sVar24;
  ulong uVar19;
  ulong uVar20;
  short sVar25;
  short sVar26;
  ushort uVar27;
  short sVar30;
  short sVar31;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar32;
  int i_1;
  __m128i d [8];
  __m128i dstvec [4];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i shift;
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m128i c3f;
  __m128i diff;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_5cc;
  longlong local_5c8 [16];
  longlong local_548 [4];
  longlong alStack_528 [2];
  longlong alStack_518 [4];
  long local_4f8;
  long local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  undefined8 local_4d8;
  ulong uStack_4d0;
  undefined1 local_4c8 [16];
  ushort local_4b8;
  ushort uStack_4b6;
  ushort uStack_4b4;
  ushort uStack_4b2;
  ushort uStack_4b0;
  ushort uStack_4ae;
  ushort uStack_4ac;
  ushort uStack_4aa;
  ushort local_4a8;
  ushort uStack_4a6;
  ushort uStack_4a4;
  ushort uStack_4a2;
  ushort uStack_4a0;
  ushort uStack_49e;
  ushort uStack_49c;
  ushort uStack_49a;
  char local_498;
  char cStack_497;
  char cStack_496;
  byte bStack_495;
  char cStack_494;
  byte bStack_493;
  char cStack_492;
  byte bStack_491;
  char cStack_490;
  char cStack_48f;
  char cStack_48e;
  byte bStack_48d;
  char cStack_48c;
  byte bStack_48b;
  char cStack_48a;
  byte bStack_489;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  int local_470;
  int local_46c;
  longlong local_468;
  longlong lStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  int local_3f0;
  int local_3ec;
  byte local_3e4;
  longlong *local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined2 local_3a2;
  undefined2 local_3a0;
  undefined2 local_39e;
  undefined2 local_39c;
  undefined1 local_399;
  undefined8 *local_398;
  undefined1 (*local_390) [16];
  uint8_t local_388 [8];
  uint8_t auStack_380 [8];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined4 local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined2 local_80;
  undefined2 local_7e;
  undefined2 local_7c;
  undefined2 local_7a;
  ulong local_78;
  ulong uStack_70;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  longlong local_38;
  longlong lStack_30;
  undefined1 local_28 [3];
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20 [3];
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  local_3cc = 8;
  local_3d0 = 4;
  local_3d8 = local_548;
  local_3ec = 6 - in_ECX;
  local_3e4 = (byte)in_ECX;
  local_3f0 = 0xb << (local_3e4 & 0x1f);
  local_39c = 0x10;
  local_9a = 0x10;
  local_9c = 0x10;
  local_9e = 0x10;
  local_a0 = 0x10;
  local_a2 = 0x10;
  local_a4 = 0x10;
  local_a6 = 0x10;
  local_a8 = 0x10;
  local_438 = 0x10001000100010;
  uStack_430 = 0x10001000100010;
  local_399 = *(undefined1 *)(in_RDX + local_3f0);
  local_20[2] = local_399;
  local_20[1] = local_399;
  local_20[0] = local_399;
  local_28[2] = local_399;
  local_28[1] = local_399;
  local_28[0] = local_399;
  local_468 = CONCAT17(local_399,
                       CONCAT16(local_399,
                                CONCAT15(local_399,CONCAT14(local_399,CONCAT13(local_399,local_28)))
                               ));
  lStack_460 = CONCAT17(local_399,
                        CONCAT16(local_399,
                                 CONCAT15(local_399,CONCAT14(local_399,CONCAT13(local_399,local_20))
                                         )));
  local_39e = 0x3f;
  local_7a = 0x3f;
  local_7c = 0x3f;
  local_7e = 0x3f;
  local_80 = 0x3f;
  local_82 = 0x3f;
  local_84 = 0x3f;
  local_86 = 0x3f;
  local_88 = 0x3f;
  local_458 = 0x3f003f003f003f;
  uStack_450 = 0x3f003f003f003f;
  local_470 = 0;
  local_46c = in_R8D;
  while( true ) {
    if (3 < local_470) goto LAB_0054ff83;
    local_4dc = local_46c >> ((byte)local_3ec & 0x1f);
    local_4e0 = local_3f0 - local_4dc >> (local_3e4 & 0x1f);
    if (local_4e0 < 1) break;
    if (8 < local_4e0) {
      local_4e0 = 8;
    }
    local_390 = (undefined1 (*) [16])(in_RDX + local_4dc);
    local_4c8 = *local_390;
    local_398 = (undefined8 *)(in_RDX + local_4dc + 1);
    local_4d8 = *local_398;
    uStack_4d0 = *(ulong *)(in_RDX + local_4dc + 9);
    if (in_ECX == 0) {
      local_3a0 = (undefined2)local_46c;
      local_5a = (undefined2)local_46c;
      local_5c = (undefined2)local_46c;
      local_5e = (undefined2)local_46c;
      local_60 = (undefined2)local_46c;
      local_62 = (undefined2)local_46c;
      local_64 = (undefined2)local_46c;
      local_66 = (undefined2)local_46c;
      local_68 = (undefined2)local_46c;
      local_2b8 = CONCAT26((undefined2)local_46c,
                           CONCAT24((undefined2)local_46c,
                                    CONCAT22((undefined2)local_46c,(undefined2)local_46c)));
      uStack_2b0 = CONCAT26((undefined2)local_46c,
                            CONCAT24((undefined2)local_46c,
                                     CONCAT22((undefined2)local_46c,(undefined2)local_46c)));
      uVar20 = local_2b8 & 0x3f003f003f003f;
      uVar29 = uStack_2b0 & 0x3f003f003f003f;
      local_2fc = 1;
      local_2f8._0_2_ = (ushort)uVar20;
      local_2f8._2_2_ = (ushort)(uVar20 >> 0x10);
      local_2f8._4_2_ = (ushort)(uVar20 >> 0x20);
      local_2f8._6_2_ = (ushort)(uVar20 >> 0x30);
      uStack_2f0._0_2_ = (ushort)uVar29;
      uStack_2f0._2_2_ = (ushort)(uVar29 >> 0x10);
      uStack_2f0._4_2_ = (ushort)(uVar29 >> 0x20);
      uStack_2f0._6_2_ = (ushort)(uVar29 >> 0x30);
      uVar19 = local_358;
      uVar28 = uStack_350;
      local_2c8 = local_458;
      uStack_2c0 = uStack_450;
      local_78 = local_2b8;
      uStack_70 = uStack_2b0;
      local_4b8 = (ushort)local_2f8;
      uStack_4b6 = local_2f8._2_2_;
      uStack_4b4 = local_2f8._4_2_;
      uStack_4b2 = local_2f8._6_2_;
      uStack_4b0 = (ushort)uStack_2f0;
      uStack_4ae = uStack_2f0._2_2_;
      uStack_4ac = uStack_2f0._4_2_;
      uStack_4aa = uStack_2f0._6_2_;
    }
    else {
      local_388[0] = EvenOddMaskx[0][0];
      local_388[1] = EvenOddMaskx[0][1];
      local_388[2] = EvenOddMaskx[0][2];
      local_388[3] = EvenOddMaskx[0][3];
      local_388[4] = EvenOddMaskx[0][4];
      local_388[5] = EvenOddMaskx[0][5];
      local_388[6] = EvenOddMaskx[0][6];
      local_388[7] = EvenOddMaskx[0][7];
      auStack_380[0] = EvenOddMaskx[0][8];
      auStack_380[1] = EvenOddMaskx[0][9];
      auStack_380[2] = EvenOddMaskx[0][10];
      auStack_380[3] = EvenOddMaskx[0][0xb];
      auStack_380[4] = EvenOddMaskx[0][0xc];
      auStack_380[5] = EvenOddMaskx[0][0xd];
      auStack_380[6] = EvenOddMaskx[0][0xe];
      auStack_380[7] = EvenOddMaskx[0][0xf];
      auVar21[8] = EvenOddMaskx[0][8];
      auVar21[9] = EvenOddMaskx[0][9];
      auVar21[10] = EvenOddMaskx[0][10];
      auVar21[0xb] = EvenOddMaskx[0][0xb];
      auVar21[0xc] = EvenOddMaskx[0][0xc];
      auVar21[0xd] = EvenOddMaskx[0][0xd];
      auVar21[0xe] = EvenOddMaskx[0][0xe];
      auVar21[0xf] = EvenOddMaskx[0][0xf];
      auVar21[0] = EvenOddMaskx[0][0];
      auVar21[1] = EvenOddMaskx[0][1];
      auVar21[2] = EvenOddMaskx[0][2];
      auVar21[3] = EvenOddMaskx[0][3];
      auVar21[4] = EvenOddMaskx[0][4];
      auVar21[5] = EvenOddMaskx[0][5];
      auVar21[6] = EvenOddMaskx[0][6];
      auVar21[7] = EvenOddMaskx[0][7];
      local_4c8 = pshufb(*local_390,auVar21);
      local_4d8 = local_4c8._8_8_;
      uStack_4d0 = 0;
      local_3a2 = (undefined2)local_46c;
      local_3a = (undefined2)local_46c;
      local_3c = (undefined2)local_46c;
      local_3e = (undefined2)local_46c;
      local_40 = (undefined2)local_46c;
      local_42 = (undefined2)local_46c;
      local_44 = (undefined2)local_46c;
      local_46 = (undefined2)local_46c;
      local_48 = (undefined2)local_46c;
      local_298 = CONCAT26((undefined2)local_46c,
                           CONCAT24((undefined2)local_46c,
                                    CONCAT22((undefined2)local_46c,(undefined2)local_46c)));
      uStack_290 = CONCAT26((undefined2)local_46c,
                            CONCAT24((undefined2)local_46c,
                                     CONCAT22((undefined2)local_46c,(undefined2)local_46c)));
      auVar22._8_8_ = uStack_290;
      auVar22._0_8_ = local_298;
      local_2d8 = psllw(auVar22,ZEXT416(in_ECX));
      uVar19 = local_2d8._0_8_ & 0x3f003f003f003f;
      uVar28 = local_2d8._8_8_ & 0x3f003f003f003f;
      local_35c = 1;
      local_358._0_2_ = (ushort)uVar19;
      local_358._2_2_ = (ushort)(uVar19 >> 0x10);
      local_358._4_2_ = (ushort)(uVar19 >> 0x20);
      local_358._6_2_ = (ushort)(uVar19 >> 0x30);
      uStack_350._0_2_ = (ushort)uVar28;
      uStack_350._2_2_ = (ushort)(uVar28 >> 0x10);
      uStack_350._4_2_ = (ushort)(uVar28 >> 0x20);
      uStack_350._6_2_ = (ushort)(uVar28 >> 0x30);
      local_378 = *(undefined8 *)*local_390;
      uStack_370 = *(undefined8 *)(*local_390 + 8);
      uVar20 = local_2f8;
      uVar29 = uStack_2f0;
      local_2e8 = local_458;
      uStack_2e0 = uStack_450;
      local_58 = local_298;
      uStack_50 = uStack_290;
      local_4b8 = (ushort)local_358;
      uStack_4b6 = local_358._2_2_;
      uStack_4b4 = local_358._4_2_;
      uStack_4b2 = local_358._6_2_;
      uStack_4b0 = (ushort)uStack_350;
      uStack_4ae = uStack_350._2_2_;
      uStack_4ac = uStack_350._4_2_;
      uStack_4aa = uStack_350._6_2_;
    }
    uStack_2f0 = uVar29;
    local_2f8 = uVar20;
    uStack_350 = uVar28;
    local_358 = uVar19;
    uStack_4aa = uStack_4aa >> 1;
    uStack_4ac = uStack_4ac >> 1;
    uStack_4ae = uStack_4ae >> 1;
    uStack_4b0 = uStack_4b0 >> 1;
    uStack_4b2 = uStack_4b2 >> 1;
    uStack_4b4 = uStack_4b4 >> 1;
    uStack_4b6 = uStack_4b6 >> 1;
    local_4b8 = local_4b8 >> 1;
    local_218._0_8_ = local_4c8._0_8_;
    auVar21 = pmovzxbw(local_4c8,local_218._0_8_);
    local_228._8_8_ = uStack_4d0;
    local_228._0_8_ = local_4d8;
    auVar22 = pmovzxbw(local_228,local_4d8);
    local_418._0_8_ = auVar22._0_8_;
    uVar1 = local_418._0_8_;
    local_418._8_8_ = auVar22._8_8_;
    uVar2 = local_418._8_8_;
    local_408._0_8_ = auVar21._0_8_;
    uVar3 = local_408._0_8_;
    local_408._8_8_ = auVar21._8_8_;
    uVar4 = local_408._8_8_;
    local_1d8._0_2_ = auVar22._0_2_;
    local_1d8._2_2_ = auVar22._2_2_;
    local_1d8._4_2_ = auVar22._4_2_;
    local_1d8._6_2_ = auVar22._6_2_;
    uStack_1d0._0_2_ = auVar22._8_2_;
    uStack_1d0._2_2_ = auVar22._10_2_;
    uStack_1d0._4_2_ = auVar22._12_2_;
    uStack_1d0._6_2_ = auVar22._14_2_;
    local_1e8._0_2_ = auVar21._0_2_;
    local_1e8._2_2_ = auVar21._2_2_;
    local_1e8._4_2_ = auVar21._4_2_;
    local_1e8._6_2_ = auVar21._6_2_;
    uStack_1e0._0_2_ = auVar21._8_2_;
    uStack_1e0._2_2_ = auVar21._10_2_;
    uStack_1e0._4_2_ = auVar21._12_2_;
    uStack_1e0._6_2_ = auVar21._14_2_;
    local_258 = local_408._0_8_;
    uStack_250 = local_408._8_8_;
    local_25c = 5;
    auVar21 = psllw(auVar21,ZEXT416(5));
    local_428 = auVar21._0_8_;
    uVar5 = local_428;
    uStack_420 = auVar21._8_8_;
    uVar6 = uStack_420;
    local_158._0_2_ = auVar21._0_2_;
    local_158._2_2_ = auVar21._2_2_;
    local_158._4_2_ = auVar21._4_2_;
    local_158._6_2_ = auVar21._6_2_;
    uStack_150._0_2_ = auVar21._8_2_;
    uStack_150._2_2_ = auVar21._10_2_;
    uStack_150._4_2_ = auVar21._12_2_;
    uStack_150._6_2_ = auVar21._14_2_;
    local_428._0_4_ = CONCAT22(local_158._2_2_ + 0x10,(short)local_158 + 0x10);
    local_428._0_6_ = CONCAT24(local_158._4_2_ + 0x10,(undefined4)local_428);
    local_428 = CONCAT26(local_158._6_2_ + 0x10,(undefined6)local_428);
    uStack_420._0_2_ = (short)uStack_150 + 0x10;
    uStack_420._2_2_ = uStack_150._2_2_ + 0x10;
    uStack_420._4_2_ = uStack_150._4_2_ + 0x10;
    uStack_420._6_2_ = uStack_150._6_2_ + 0x10;
    local_118 = CONCAT26(local_1d8._6_2_ - local_1e8._6_2_,
                         CONCAT24(local_1d8._4_2_ - local_1e8._4_2_,
                                  CONCAT22(local_1d8._2_2_ - local_1e8._2_2_,
                                           (short)local_1d8 - (short)local_1e8)));
    uStack_110 = CONCAT26(uStack_1d0._6_2_ - uStack_1e0._6_2_,
                          CONCAT24(uStack_1d0._4_2_ - uStack_1e0._4_2_,
                                   CONCAT22(uStack_1d0._2_2_ - uStack_1e0._2_2_,
                                            (short)uStack_1d0 - (short)uStack_1e0)));
    local_128 = CONCAT26(uStack_4b2,CONCAT24(uStack_4b4,CONCAT22(uStack_4b6,local_4b8)));
    uStack_120 = CONCAT26(uStack_4aa,CONCAT24(uStack_4ac,CONCAT22(uStack_4ae,uStack_4b0)));
    sVar17 = ((short)local_1d8 - (short)local_1e8) * local_4b8;
    sVar23 = (local_1d8._2_2_ - local_1e8._2_2_) * uStack_4b6;
    sVar24 = (local_1d8._4_2_ - local_1e8._4_2_) * uStack_4b4;
    sVar25 = (local_1d8._6_2_ - local_1e8._6_2_) * uStack_4b2;
    sVar26 = ((short)uStack_1d0 - (short)uStack_1e0) * uStack_4b0;
    sVar30 = (uStack_1d0._2_2_ - uStack_1e0._2_2_) * uStack_4ae;
    sVar31 = (uStack_1d0._4_2_ - uStack_1e0._4_2_) * uStack_4ac;
    sVar32 = (uStack_1d0._6_2_ - uStack_1e0._6_2_) * uStack_4aa;
    local_178 = local_428;
    uStack_170 = uStack_420;
    local_188 = CONCAT26(sVar25,CONCAT24(sVar24,CONCAT22(sVar23,sVar17)));
    uStack_180 = CONCAT26(sVar32,CONCAT24(sVar31,CONCAT22(sVar30,sVar26)));
    uVar18 = (short)local_158 + 0x10 + sVar17;
    sVar23 = local_158._2_2_ + 0x10 + sVar23;
    sVar24 = local_158._4_2_ + 0x10 + sVar24;
    sVar25 = local_158._6_2_ + 0x10 + sVar25;
    uVar27 = (short)uStack_150 + 0x10 + sVar26;
    sVar30 = uStack_150._2_2_ + 0x10 + sVar30;
    sVar31 = uStack_150._4_2_ + 0x10 + sVar31;
    sVar32 = uStack_150._6_2_ + 0x10 + sVar32;
    cStack_496 = (char)sVar23;
    bStack_495 = (byte)((ushort)sVar23 >> 8);
    cStack_494 = (char)sVar24;
    bStack_493 = (byte)((ushort)sVar24 >> 8);
    cStack_492 = (char)sVar25;
    bStack_491 = (byte)((ushort)sVar25 >> 8);
    cStack_48e = (char)sVar30;
    bStack_48d = (byte)((ushort)sVar30 >> 8);
    cStack_48c = (char)sVar31;
    bStack_48b = (byte)((ushort)sVar31 >> 8);
    cStack_48a = (char)sVar32;
    bStack_489 = (byte)((ushort)sVar32 >> 8);
    uVar9 = CONCAT13(bStack_495,CONCAT12(cStack_496,uVar18));
    uVar10 = CONCAT15(bStack_493,CONCAT14(cStack_494,uVar9));
    local_318 = CONCAT17(bStack_491,CONCAT16(cStack_492,uVar10));
    uVar12 = CONCAT13(bStack_48d,CONCAT12(cStack_48e,uVar27));
    uVar13 = CONCAT15(bStack_48b,CONCAT14(cStack_48c,uVar12));
    uStack_310 = CONCAT17(bStack_489,CONCAT16(cStack_48a,uVar13));
    local_31c = 5;
    uVar18 = uVar18 >> 5;
    uVar27 = uVar27 >> 5;
    cStack_496 = (char)(ushort)((uint)uVar9 >> 0x15);
    bStack_495 = bStack_495 >> 5;
    cStack_494 = (char)(ushort)((uint6)uVar10 >> 0x25);
    bStack_493 = bStack_493 >> 5;
    cStack_492 = (char)(ushort)((ulong)local_318 >> 0x35);
    bStack_491 = bStack_491 >> 5;
    cStack_48e = (char)(ushort)((uint)uVar12 >> 0x15);
    bStack_48d = bStack_48d >> 5;
    cStack_48c = (char)(ushort)((uint6)uVar13 >> 0x25);
    bStack_48b = bStack_48b >> 5;
    cStack_48a = (char)(ushort)((ulong)uStack_310 >> 0x35);
    bStack_489 = bStack_489 >> 5;
    local_238._0_8_ = local_4c8._8_8_;
    local_408 = pmovzxbw(local_4c8 >> 0x40,local_238._0_8_);
    local_248._8_8_ = 0;
    local_248._0_8_ = uStack_4d0;
    local_418 = pmovzxbw(local_248,uStack_4d0);
    local_1f8._0_2_ = local_418._0_2_;
    local_1f8._2_2_ = local_418._2_2_;
    local_1f8._4_2_ = local_418._4_2_;
    local_1f8._6_2_ = local_418._6_2_;
    uStack_1f0._0_2_ = local_418._8_2_;
    uStack_1f0._2_2_ = local_418._10_2_;
    uStack_1f0._4_2_ = local_418._12_2_;
    uStack_1f0._6_2_ = local_418._14_2_;
    local_208._0_2_ = local_408._0_2_;
    local_208._2_2_ = local_408._2_2_;
    local_208._4_2_ = local_408._4_2_;
    local_208._6_2_ = local_408._6_2_;
    uStack_200._0_2_ = local_408._8_2_;
    uStack_200._2_2_ = local_408._10_2_;
    uStack_200._4_2_ = local_408._12_2_;
    uStack_200._6_2_ = local_408._14_2_;
    local_448 = (short)local_1f8 - (short)local_208;
    sStack_446 = local_1f8._2_2_ - local_208._2_2_;
    sStack_444 = local_1f8._4_2_ - local_208._4_2_;
    sStack_442 = local_1f8._6_2_ - local_208._6_2_;
    sStack_440 = (short)uStack_1f0 - (short)uStack_200;
    sStack_43e = uStack_1f0._2_2_ - uStack_200._2_2_;
    sStack_43c = uStack_1f0._4_2_ - uStack_200._4_2_;
    sStack_43a = uStack_1f0._6_2_ - uStack_200._6_2_;
    local_278 = local_408._0_8_;
    uStack_270 = local_408._8_8_;
    local_27c = 5;
    auVar21 = psllw(local_408,ZEXT416(5));
    local_428 = auVar21._0_8_;
    uVar7 = local_428;
    uStack_420 = auVar21._8_8_;
    uVar8 = uStack_420;
    local_198._0_2_ = auVar21._0_2_;
    local_198._2_2_ = auVar21._2_2_;
    local_198._4_2_ = auVar21._4_2_;
    local_198._6_2_ = auVar21._6_2_;
    uStack_190._0_2_ = auVar21._8_2_;
    uStack_190._2_2_ = auVar21._10_2_;
    uStack_190._4_2_ = auVar21._12_2_;
    uStack_190._6_2_ = auVar21._14_2_;
    local_428._0_4_ = CONCAT22(local_198._2_2_ + 0x10,(short)local_198 + 0x10);
    local_428._0_6_ = CONCAT24(local_198._4_2_ + 0x10,(undefined4)local_428);
    local_428 = CONCAT26(local_198._6_2_ + 0x10,(undefined6)local_428);
    uStack_420._0_2_ = (short)uStack_190 + 0x10;
    uStack_420._2_2_ = uStack_190._2_2_ + 0x10;
    uStack_420._4_2_ = uStack_190._4_2_ + 0x10;
    uStack_420._6_2_ = uStack_190._6_2_ + 0x10;
    local_138 = CONCAT26(sStack_442,CONCAT24(sStack_444,CONCAT22(sStack_446,local_448)));
    uStack_130 = CONCAT26(sStack_43a,CONCAT24(sStack_43c,CONCAT22(sStack_43e,sStack_440)));
    local_148 = CONCAT26(uStack_4b2,CONCAT24(uStack_4b4,CONCAT22(uStack_4b6,local_4b8)));
    uStack_140 = CONCAT26(uStack_4aa,CONCAT24(uStack_4ac,CONCAT22(uStack_4ae,uStack_4b0)));
    local_488 = local_448 * local_4b8;
    sStack_486 = sStack_446 * uStack_4b6;
    sStack_484 = sStack_444 * uStack_4b4;
    sStack_482 = sStack_442 * uStack_4b2;
    sStack_480 = sStack_440 * uStack_4b0;
    sStack_47e = sStack_43e * uStack_4ae;
    sStack_47c = sStack_43c * uStack_4ac;
    sStack_47a = sStack_43a * uStack_4aa;
    local_1b8 = local_428;
    uStack_1b0 = uStack_420;
    local_1c8 = CONCAT26(sStack_482,CONCAT24(sStack_484,CONCAT22(sStack_486,local_488)));
    uStack_1c0 = CONCAT26(sStack_47a,CONCAT24(sStack_47c,CONCAT22(sStack_47e,sStack_480)));
    local_4a8 = (short)local_198 + 0x10 + local_488;
    uStack_4a6 = local_198._2_2_ + 0x10 + sStack_486;
    uStack_4a4 = local_198._4_2_ + 0x10 + sStack_484;
    uStack_4a2 = local_198._6_2_ + 0x10 + sStack_482;
    uStack_4a0 = (short)uStack_190 + 0x10 + sStack_480;
    uStack_49e = uStack_190._2_2_ + 0x10 + sStack_47e;
    uStack_49c = uStack_190._4_2_ + 0x10 + sStack_47c;
    uStack_49a = uStack_190._6_2_ + 0x10 + sStack_47a;
    local_338 = CONCAT26(uStack_4a2,CONCAT24(uStack_4a4,CONCAT22(uStack_4a6,local_4a8)));
    uStack_330 = CONCAT26(uStack_49a,CONCAT24(uStack_49c,CONCAT22(uStack_49e,uStack_4a0)));
    local_33c = 5;
    local_4a8 = local_4a8 >> 5;
    uStack_4a6 = uStack_4a6 >> 5;
    uStack_4a4 = uStack_4a4 >> 5;
    uStack_4a2 = uStack_4a2 >> 5;
    uStack_4a0 = uStack_4a0 >> 5;
    uStack_49e = uStack_49e >> 5;
    uStack_49c = uStack_49c >> 5;
    uStack_49a = uStack_49a >> 5;
    uVar9 = CONCAT13(bStack_495,CONCAT12(cStack_496,uVar18));
    uVar10 = CONCAT15(bStack_493,CONCAT14(cStack_494,uVar9));
    uVar11 = CONCAT17(bStack_491,CONCAT16(cStack_492,uVar10));
    uVar12 = CONCAT13(bStack_48d,CONCAT12(cStack_48e,uVar27));
    uVar13 = CONCAT15(bStack_48b,CONCAT14(cStack_48c,uVar12));
    uVar14 = CONCAT17(bStack_489,CONCAT16(cStack_48a,uVar13));
    local_108 = CONCAT26(uStack_4a2,CONCAT24(uStack_4a4,CONCAT22(uStack_4a6,local_4a8)));
    uStack_100 = CONCAT26(uStack_49a,CONCAT24(uStack_49c,CONCAT22(uStack_49e,uStack_4a0)));
    local_f8._2_2_ = (ushort)((uint)uVar9 >> 0x10);
    local_f8._4_2_ = (ushort)((uint6)uVar10 >> 0x20);
    local_f8._6_2_ = (ushort)((ulong)uVar11 >> 0x30);
    uStack_f0._2_2_ = (ushort)((uint)uVar12 >> 0x10);
    uStack_f0._4_2_ = (ushort)((uint6)uVar13 >> 0x20);
    uStack_f0._6_2_ = (ushort)((ulong)uVar14 >> 0x30);
    local_498 = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
    cStack_497 = (local_f8._2_2_ != 0) * (local_f8._2_2_ < 0x100) * cStack_496 -
                 (0xff < local_f8._2_2_);
    cStack_496 = (local_f8._4_2_ != 0) * (local_f8._4_2_ < 0x100) * cStack_494 -
                 (0xff < local_f8._4_2_);
    bStack_495 = (local_f8._6_2_ != 0) * (local_f8._6_2_ < 0x100) * cStack_492 -
                 (0xff < local_f8._6_2_);
    cStack_494 = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    bStack_493 = (uStack_f0._2_2_ != 0) * (uStack_f0._2_2_ < 0x100) * cStack_48e -
                 (0xff < uStack_f0._2_2_);
    cStack_492 = (uStack_f0._4_2_ != 0) * (uStack_f0._4_2_ < 0x100) * cStack_48c -
                 (0xff < uStack_f0._4_2_);
    bStack_491 = (uStack_f0._6_2_ != 0) * (uStack_f0._6_2_ < 0x100) * cStack_48a -
                 (0xff < uStack_f0._6_2_);
    cStack_490 = (local_4a8 != 0) * (local_4a8 < 0x100) * (char)local_4a8 - (0xff < local_4a8);
    cStack_48f = (uStack_4a6 != 0) * (uStack_4a6 < 0x100) * (char)uStack_4a6 - (0xff < uStack_4a6);
    cStack_48e = (uStack_4a4 != 0) * (uStack_4a4 < 0x100) * (char)uStack_4a4 - (0xff < uStack_4a4);
    bStack_48d = (uStack_4a2 != 0) * (uStack_4a2 < 0x100) * (char)uStack_4a2 - (0xff < uStack_4a2);
    cStack_48c = (uStack_4a0 != 0) * (uStack_4a0 < 0x100) * (char)uStack_4a0 - (0xff < uStack_4a0);
    bStack_48b = (uStack_49e != 0) * (uStack_49e < 0x100) * (char)uStack_49e - (0xff < uStack_49e);
    cStack_48a = (uStack_49c != 0) * (uStack_49c < 0x100) * (char)uStack_49c - (0xff < uStack_49c);
    bStack_489 = (uStack_49a != 0) * (uStack_49a < 0x100) * (char)uStack_49a - (0xff < uStack_49a);
    local_d8 = CONCAT17(bStack_491,
                        CONCAT16(cStack_492,
                                 CONCAT15(bStack_493,
                                          CONCAT14(cStack_494,
                                                   CONCAT13(bStack_495,
                                                            CONCAT12(cStack_496,
                                                                     CONCAT11(cStack_497,local_498))
                                                           )))));
    uStack_d0 = CONCAT17(bStack_489,
                         CONCAT16(cStack_48a,
                                  CONCAT15(bStack_48b,
                                           CONCAT14(cStack_48c,
                                                    CONCAT13(bStack_48d,
                                                             CONCAT12(cStack_48e,
                                                                      CONCAT11(cStack_48f,cStack_490
                                                                              )))))));
    local_e8 = *(undefined8 *)Mask[0][local_4e0];
    uStack_e0 = *(undefined8 *)(Mask[0][local_4e0] + 8);
    auVar16._8_8_ = lStack_460;
    auVar16._0_8_ = local_468;
    auVar15._8_8_ = uStack_d0;
    auVar15._0_8_ = local_d8;
    auVar21 = pblendvb(auVar16,auVar15,(undefined1  [16])Mask[0][local_4e0]);
    *(undefined1 (*) [16])(local_3d8 + (long)local_470 * 2) = auVar21;
    local_46c = in_R8D + local_46c;
    local_470 = local_470 + 1;
    local_238 = local_4c8 >> 0x40;
    local_218 = local_4c8;
    local_208 = local_408._0_8_;
    uStack_200 = local_408._8_8_;
    local_1f8 = local_418._0_8_;
    uStack_1f0 = local_418._8_8_;
    local_1e8 = uVar3;
    uStack_1e0 = uVar4;
    local_1d8 = uVar1;
    uStack_1d0 = uVar2;
    local_1a8 = local_438;
    uStack_1a0 = uStack_430;
    local_198 = uVar7;
    uStack_190 = uVar8;
    local_168 = local_438;
    uStack_160 = uStack_430;
    local_158 = uVar5;
    uStack_150 = uVar6;
    local_f8 = uVar11;
    uStack_f0 = uVar14;
    local_c8 = local_468;
    lStack_c0 = lStack_460;
  }
  for (local_4e4 = local_470; local_4e4 < 4; local_4e4 = local_4e4 + 1) {
    local_3d8[(long)local_4e4 * 2] = local_468;
    local_548[(long)local_4e4 * 2 + 1] = lStack_460;
  }
LAB_0054ff83:
  local_4f8 = in_RSI;
  local_4f0 = in_RDI;
  local_b8 = local_438;
  uStack_b0 = uStack_430;
  local_98 = local_458;
  uStack_90 = uStack_450;
  local_38 = local_468;
  lStack_30 = lStack_460;
  local_25 = local_399;
  local_24 = local_399;
  local_23 = local_399;
  local_22 = local_399;
  local_21 = local_399;
  local_1d = local_399;
  local_1c = local_399;
  local_1b = local_399;
  local_1a = local_399;
  local_19 = local_399;
  transpose4x8_8x4_sse2
            ((__m128i *)local_548,(__m128i *)(local_548 + 2),(__m128i *)(local_548 + 4),
             (__m128i *)alStack_518,(__m128i *)local_5c8,(__m128i *)(local_5c8 + 2),
             (__m128i *)(local_5c8 + 4),(__m128i *)(local_5c8 + 6),(__m128i *)(local_5c8 + 8),
             (__m128i *)(local_5c8 + 10),(__m128i *)(local_5c8 + 0xc),(__m128i *)(local_5c8 + 0xe));
  for (local_5cc = 0; local_5cc < 8; local_5cc = local_5cc + 1) {
    local_3c8 = (undefined4)local_5c8[(long)local_5cc * 2];
    *(undefined4 *)(local_4f0 + local_4f8 * local_5cc) = local_3c8;
  }
  return;
}

Assistant:

static void dr_prediction_z3_4x8_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                        const uint8_t *left, int upsample_left,
                                        int dy) {
  __m128i dstvec[4], d[8];

  dr_prediction_z1_HxW_internal_sse4_1(8, 4, dstvec, left, upsample_left, dy);
  transpose4x8_8x4_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3], &d[0],
                        &d[1], &d[2], &d[3], &d[4], &d[5], &d[6], &d[7]);
  for (int i = 0; i < 8; i++) {
    *(int *)(dst + stride * i) = _mm_cvtsi128_si32(d[i]);
  }
}